

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void __thiscall QGuiApplicationPrivate::notifyWindowIconChanged(QGuiApplicationPrivate *this)

{
  int i;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QWindow_*> local_48;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,ApplicationWindowIconChange);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_48.size; puVar1 = puVar1 + 1) {
    QCoreApplication::sendEvent((QObject *)local_48.ptr[(long)puVar1],(QEvent *)&local_28);
  }
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&local_48);
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i)
        QCoreApplication::sendEvent(list.at(i), &ev);
}